

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> __thiscall
Parser::parseUnaryExpr(Parser *this)

{
  TokenType tok;
  pointer *__ptr;
  Parser *in_RSI;
  pointer puVar1;
  undefined1 local_58 [8];
  TokenType op;
  undefined4 uStack_4c;
  vector<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>,_std::allocator<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>_>_>
  args;
  
  tok = (in_RSI->m_currToken).type;
  switch(tok) {
  case LeftParen:
    eatToken(in_RSI,LeftParen);
    parseOrExpr(this);
    eatToken(in_RSI,RightParen);
    break;
  default:
    (this->m_lexer).m_input._M_dataplus._M_p = (pointer)0x0;
    break;
  case Ampersand:
  case Plus:
  case Minus:
  case Bang:
    op = tok;
    eatToken(in_RSI,tok);
    parseUnaryExpr((Parser *)&args);
    std::
    make_unique<AST::UnaryExpr,TokenType&,std::unique_ptr<AST::Expr,std::default_delete<AST::Expr>>>
              ((TokenType *)local_58,(unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> *)&op);
    (this->m_lexer).m_input._M_dataplus._M_p = (pointer)CONCAT71(local_58._1_7_,local_58[0]);
    puVar1 = args.
             super__Vector_base<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>,_std::allocator<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
LAB_0013bf8a:
    if (puVar1 != (pointer)0x0) {
      (*(code *)(puVar1->_M_t).super___uniq_ptr_impl<AST::Expr,_std::default_delete<AST::Expr>_>.
                _M_t.super__Tuple_impl<0UL,_AST::Expr_*,_std::default_delete<AST::Expr>_>.
                super__Head_base<0UL,_AST::Expr_*,_false>._M_head_impl[1].super_Stmt._vptr_Stmt)();
    }
    break;
  case String:
    std::__cxx11::string::string((string *)&args,(string *)&(in_RSI->m_currToken).literal);
    eatToken(in_RSI,(in_RSI->m_currToken).type);
    std::make_unique<AST::StringLit,std::__cxx11::string&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
    goto LAB_0013c0e0;
  case Integer:
    std::__cxx11::string::string((string *)&args,(string *)&(in_RSI->m_currToken).literal);
    eatToken(in_RSI,(in_RSI->m_currToken).type);
    std::make_unique<AST::IntegerLit,std::__cxx11::string&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
    goto LAB_0013c0e0;
  case Float:
    std::__cxx11::string::string((string *)&args,(string *)&(in_RSI->m_currToken).literal);
    eatToken(in_RSI,(in_RSI->m_currToken).type);
    std::make_unique<AST::FloatLit,std::__cxx11::string&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
LAB_0013c0e0:
    (this->m_lexer).m_input._M_dataplus._M_p = (pointer)CONCAT71(local_58._1_7_,local_58[0]);
    std::__cxx11::string::~string((string *)&args);
    break;
  case True:
    eatToken(in_RSI,True);
    local_58[0] = LeftBrace;
    goto LAB_0013c104;
  case False:
    eatToken(in_RSI,False);
    local_58[0] = Comma;
LAB_0013c104:
    std::make_unique<AST::BooleanLit,bool>((bool *)&args);
LAB_0013c114:
    (this->m_lexer).m_input._M_dataplus._M_p =
         (pointer)args.
                  super__Vector_base<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>,_std::allocator<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    break;
  case Identifier:
    std::make_unique<AST::Identifier,std::__cxx11::string&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
    eatToken(in_RSI,(in_RSI->m_currToken).type);
    if ((in_RSI->m_currToken).type == LeftParen) {
      args.
      super__Vector_base<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>,_std::allocator<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      args.
      super__Vector_base<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>,_std::allocator<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      args.
      super__Vector_base<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>,_std::allocator<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      eatToken(in_RSI,LeftParen);
      while ((in_RSI->m_currToken).type != RightParen) {
        parseOrExpr((Parser *)&op);
        if ((in_RSI->m_currToken).type != RightParen) {
          eatToken(in_RSI,Comma);
        }
        std::
        vector<std::unique_ptr<AST::Expr,std::default_delete<AST::Expr>>,std::allocator<std::unique_ptr<AST::Expr,std::default_delete<AST::Expr>>>>
        ::emplace_back<std::unique_ptr<AST::Expr,std::default_delete<AST::Expr>>>
                  ((vector<std::unique_ptr<AST::Expr,std::default_delete<AST::Expr>>,std::allocator<std::unique_ptr<AST::Expr,std::default_delete<AST::Expr>>>>
                    *)&args,(unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> *)&op);
        if ((long *)CONCAT44(uStack_4c,op) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(uStack_4c,op) + 8))();
        }
      }
      eatToken(in_RSI,RightParen);
      std::
      make_unique<AST::FnCall,std::unique_ptr<AST::Identifier,std::default_delete<AST::Identifier>>,std::vector<std::unique_ptr<AST::Expr,std::default_delete<AST::Expr>>,std::allocator<std::unique_ptr<AST::Expr,std::default_delete<AST::Expr>>>>>
                ((unique_ptr<AST::Identifier,_std::default_delete<AST::Identifier>_> *)&op,
                 (vector<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>,_std::allocator<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>_>_>
                  *)local_58);
      (this->m_lexer).m_input._M_dataplus._M_p = (pointer)CONCAT44(uStack_4c,op);
      std::
      vector<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>,_std::allocator<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>_>_>
      ::~vector(&args);
      puVar1 = (pointer)CONCAT71(local_58._1_7_,local_58[0]);
      goto LAB_0013bf8a;
    }
    args.
    super__Vector_base<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>,_std::allocator<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT71(local_58._1_7_,local_58[0]);
    goto LAB_0013c114;
  }
  return (__uniq_ptr_data<AST::Expr,_std::default_delete<AST::Expr>,_true,_true>)
         (__uniq_ptr_data<AST::Expr,_std::default_delete<AST::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<AST::Expr> Parser::parseUnaryExpr() {
    if (m_currToken.type == TokenType::Plus ||
        m_currToken.type == TokenType::Minus ||
        m_currToken.type == TokenType::Bang ||
        m_currToken.type == TokenType::Ampersand) {
        TokenType op = m_currToken.type;
        eatToken(m_currToken.type);
        auto operand = parseUnaryExpr();
        return std::make_unique<AST::UnaryExpr>(op,
                                                std::move(operand));
    } else if (m_currToken.type == TokenType::LeftParen) {
        eatToken(m_currToken.type);
        auto expr = parseExpr();
        eatToken(TokenType::RightParen);
        return expr;
    } else if (m_currToken.type == TokenType::String) {
        std::string lit = m_currToken.literal;
        eatToken(m_currToken.type);
        return std::make_unique<AST::StringLit>(lit);
    } else if (m_currToken.type == TokenType::Integer) {
        std::string lit = m_currToken.literal;
        eatToken(m_currToken.type);
        return std::make_unique<AST::IntegerLit>(lit);
    } else if (m_currToken.type == TokenType::Float) {
        std::string lit = m_currToken.literal;
        eatToken(m_currToken.type);
        return std::make_unique<AST::FloatLit>(lit);
    } else if (m_currToken.type == TokenType::True) {
        eatToken(m_currToken.type);
        return std::make_unique<AST::BooleanLit>(true);
    } else if (m_currToken.type == TokenType::False) {
        eatToken(m_currToken.type);
        return std::make_unique<AST::BooleanLit>(false);
    } else if (m_currToken.type == TokenType::Identifier) {
        auto id = std::make_unique<AST::Identifier>(m_currToken.literal);
        eatToken(m_currToken.type);
        if (m_currToken.type == TokenType::LeftParen) {
            // function call
            std::vector<std::unique_ptr<AST::Expr>> args;
            eatToken(m_currToken.type);
            while (m_currToken.type != TokenType::RightParen) {
                auto arg = parseExpr();
                if (m_currToken.type != TokenType::RightParen) {
                    eatToken(TokenType::Comma);
                }
                args.push_back(std::move(arg));
            }
            eatToken(TokenType::RightParen);
            return std::make_unique<AST::FnCall>(std::move(id), std::move(args));
        }
        return static_cast<std::unique_ptr<AST::Expr>>(std::move(id));
    }
    return nullptr;
}